

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O2

int __thiscall amrex::MultiCutFab::remove(MultiCutFab *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  BaseFab<double> *this_00;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,(FabArrayBase *)this,'\0');
  while (mfi.currentIndex < mfi.endIndex) {
    bVar1 = ok(this,&mfi);
    if (!bVar1) {
      this_00 = (BaseFab<double> *)FabArray<amrex::CutFab>::release(&this->m_data,&mfi);
      if (this_00 != (BaseFab<double> *)0x0) {
        BaseFab<double>::~BaseFab(this_00);
      }
      operator_delete(this_00,0x48);
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return extraout_EAX;
}

Assistant:

void
MultiCutFab::remove ()
{
    for (MFIter mfi(m_data); mfi.isValid(); ++mfi)
    {
        if (!ok(mfi))
        {
            delete m_data.release(mfi);
        }
    }
}